

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O3

bool __thiscall
libwebm::VpxPesParser::RemoveStartCodeEmulationPreventionBytes
          (VpxPesParser *this,uint8_t *raw_data,size_t bytes_required,PacketData *processed_data,
          size_t *bytes_consumed)

{
  pointer *ppuVar1;
  iterator __position;
  size_t sVar2;
  uchar *puVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  uint8_t byte;
  uchar local_41;
  size_t *local_40;
  uchar *local_38;
  
  if (processed_data == (PacketData *)0x0 || bytes_required == 0) {
LAB_0010cac6:
    bVar6 = false;
  }
  else {
    puVar3 = *(uchar **)(this + 0x60);
    sVar2 = 0;
    uVar5 = 0;
    lVar4 = 0;
    local_40 = bytes_consumed;
    local_38 = puVar3;
    do {
      if (puVar3 < raw_data + sVar2) goto LAB_0010cac6;
      local_41 = raw_data[sVar2];
      if (local_41 == '\0') {
        lVar4 = lVar4 + 1;
LAB_0010ca8b:
        __position._M_current =
             (processed_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (processed_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)processed_data,
                     __position,&local_41);
          puVar3 = local_38;
        }
        else {
          *__position._M_current = local_41;
          ppuVar1 = &(processed_data->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar5 = uVar5 + 1;
      }
      else {
        bVar6 = lVar4 != 2;
        lVar4 = 0;
        if (bVar6 || local_41 != '\x03') goto LAB_0010ca8b;
        lVar4 = 0;
      }
      sVar2 = sVar2 + 1;
    } while (uVar5 < bytes_required);
    *local_40 = sVar2;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool VpxPesParser::RemoveStartCodeEmulationPreventionBytes(
    const std::uint8_t* raw_data, std::size_t bytes_required,
    PacketData* processed_data, std::size_t* bytes_consumed) const {
  if (bytes_required == 0 || !processed_data)
    return false;

  std::size_t num_zeros = 0;
  std::size_t bytes_copied = 0;
  const std::uint8_t* const end_of_input =
      &pes_file_data_[0] + pes_file_data_.size();
  std::size_t i;
  for (i = 0; bytes_copied < bytes_required; ++i) {
    if (raw_data + i > end_of_input)
      return false;

    bool skip = false;

    const std::uint8_t byte = raw_data[i];
    if (byte == 0) {
      ++num_zeros;
    } else if (byte == 0x3 && num_zeros == 2) {
      skip = true;
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    if (skip == false) {
      processed_data->push_back(byte);
      ++bytes_copied;
    }
  }
  *bytes_consumed = i;
  return true;
}